

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O1

void Commands::Learn(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *arguments,Character *from)

{
  World *pWVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  mapped_type *this;
  short spell;
  short sVar6;
  _List_node_base *p_Var7;
  PacketBuilder builder;
  undefined1 local_60 [48];
  
  iVar3 = util::to_int((arguments->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
  sVar6 = -1;
  if (0x20 < (ulong)((long)(arguments->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(arguments->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start)) {
    pWVar1 = from->world;
    local_60._0_8_ = local_60 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"MaxSkillLevel","");
    this = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,(key_type *)local_60);
    iVar4 = util::variant::GetInt(this);
    iVar5 = util::to_int((arguments->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
    if (iVar5 < iVar4) {
      iVar4 = iVar5;
    }
    iVar5 = 0;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    sVar6 = (short)iVar5;
    if ((undefined1 *)local_60._0_8_ != local_60 + 0x10) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
    }
  }
  spell = (short)iVar3;
  bVar2 = Character::AddSpell(from,spell);
  if (bVar2) {
    PacketBuilder::PacketBuilder((PacketBuilder *)local_60,PACKET_STATSKILL,PACKET_TAKE,6);
    PacketBuilder::AddShort((PacketBuilder *)local_60,(int)spell);
    iVar3 = Character::HasItem(from,1,false);
    PacketBuilder::AddInt((PacketBuilder *)local_60,iVar3);
    Character::Send(from,(PacketBuilder *)local_60);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_60);
  }
  if (-1 < sVar6) {
    p_Var7 = (from->spells).super__List_base<Character_Spell,_std::allocator<Character_Spell>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    while ((p_Var7 != (_List_node_base *)&from->spells &&
           ((short)*(undefined4 *)&p_Var7[1]._M_next != spell))) {
      p_Var7 = p_Var7->_M_next;
    }
    if (p_Var7 != (_List_node_base *)&from->spells) {
      *(char *)((long)&p_Var7[1]._M_next + 2) = (char)sVar6;
      PacketBuilder::PacketBuilder((PacketBuilder *)local_60,PACKET_STATSKILL,PACKET_ACCEPT,6);
      PacketBuilder::AddShort((PacketBuilder *)local_60,from->skillpoints);
      PacketBuilder::AddShort((PacketBuilder *)local_60,(int)spell);
      PacketBuilder::AddShort
                ((PacketBuilder *)local_60,(uint)*(byte *)((long)&p_Var7[1]._M_next + 2));
      Character::Send(from,(PacketBuilder *)local_60);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_60);
    }
  }
  return;
}

Assistant:

void Learn(const std::vector<std::string>& arguments, Character* from)
{
	short skill_id = util::to_int(arguments[0]);
	short level = -1;

	if (arguments.size() >= 2)
		level = std::max(0, std::min<int>(from->world->config["MaxSkillLevel"], util::to_int(arguments[1])));

	if (from->AddSpell(skill_id))
	{
		PacketBuilder builder(PACKET_STATSKILL, PACKET_TAKE, 6);
		builder.AddShort(skill_id);
		builder.AddInt(from->HasItem(1));
		from->Send(builder);
	}

	if (level >= 0)
	{
		auto it = std::find_if(UTIL_RANGE(from->spells), [&](Character_Spell spell) { return spell.id == skill_id; });

		if (it != from->spells.end())
		{
			it->level = level;

			PacketBuilder builder(PACKET_STATSKILL, PACKET_ACCEPT, 6);
			builder.AddShort(from->skillpoints);
			builder.AddShort(skill_id);
			builder.AddShort(it->level);
			from->Send(builder);
		}
	}
}